

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall
pegmatite::StreamInput::StreamInput(StreamInput *this,string *name,istream *s,size_t len)

{
  Input::Input(&this->super_Input,name);
  (this->super_Input)._vptr_Input = (_func_int **)&PTR_fillBuffer_00165b60;
  this->length = len;
  this->stream = s;
  return;
}

Assistant:

StreamInput::StreamInput(const std::string& name, std::istream& s, size_t len)
	: Input(name), length(len), stream(s)
{
}